

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

void cleanup(EVP_PKEY_CTX *ctx)

{
  gvector in_RDX;
  inform_dist *in_RSI;
  ulong local_30;
  size_t i_1;
  size_t i;
  double **info_local;
  inform_dist *s_dist_local;
  size_t **subsets_local;
  
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    for (i_1 = 0; i_1 < *(ulong *)(ctx + -8); i_1 = i_1 + 1) {
      gvector_free(*(gvector *)(ctx + i_1 * 8));
    }
    gvector_free(ctx);
  }
  if (in_RSI != (inform_dist *)0x0) {
    inform_dist_free(in_RSI);
  }
  if (in_RDX != (gvector)0x0) {
    for (local_30 = 0; local_30 < *(ulong *)((long)in_RDX + -8); local_30 = local_30 + 1) {
      gvector_free(*(gvector *)((long)in_RDX + local_30 * 8));
    }
    gvector_free(in_RDX);
  }
  return;
}

Assistant:

static void cleanup(size_t **subsets, inform_dist *s_dist, double **info)
{
    if (subsets)
    {
        for (size_t i = 0; i < gvector_len(subsets); ++i)
        {
            gvector_free(subsets[i]);
        }
        gvector_free(subsets);
    }

    if (s_dist)
    {
        inform_dist_free(s_dist);
    }

    if (info)
    {
        for (size_t i = 0; i < gvector_len(info); ++i)
        {
            gvector_free(info[i]);
        }
        gvector_free(info);
    }
}